

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

void __thiscall
nvim::Nvim::async_buf_clear_namespace
          (Nvim *this,Buffer buffer,Integer ns_id,Integer line_start,Integer line_end)

{
  allocator local_51;
  string local_50;
  Integer local_30;
  Integer line_end_local;
  Integer line_start_local;
  Integer ns_id_local;
  Buffer buffer_local;
  Nvim *this_local;
  
  local_30 = line_end;
  line_end_local = line_start;
  line_start_local = ns_id;
  ns_id_local = buffer;
  buffer_local = (Buffer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"nvim_buf_clear_namespace",&local_51);
  NvimRPC::async_call<long,long,long,long>
            (&this->client_,&local_50,&ns_id_local,&line_start_local,&line_end_local,&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return;
}

Assistant:

void Nvim::async_buf_clear_namespace(Buffer buffer, Integer ns_id, Integer line_start, Integer line_end) {
    client_.async_call("nvim_buf_clear_namespace", buffer, ns_id, line_start, line_end);
}